

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::~ReferenceContext(ReferenceContext *this)

{
  bool bVar1;
  reference ppVVar2;
  reference ppTVar3;
  reference ppFVar4;
  reference ppRVar5;
  reference ppDVar6;
  reference ppSVar7;
  __normal_iterator<sglr::rc::ShaderProgramObjectContainer_**,_std::vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>_>
  local_128;
  __normal_iterator<sglr::rc::ShaderProgramObjectContainer_**,_std::vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>_>
  local_120;
  iterator i_5;
  vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
  programs;
  __normal_iterator<sglr::rc::DataBuffer_**,_std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>_>
  local_f8;
  __normal_iterator<sglr::rc::DataBuffer_**,_std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>_>
  local_f0;
  iterator i_4;
  vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> buffers;
  __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
  local_c8;
  __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
  local_c0;
  iterator i_3;
  vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> renderbuffers;
  __normal_iterator<sglr::rc::Framebuffer_**,_std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>_>
  local_98;
  __normal_iterator<sglr::rc::Framebuffer_**,_std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>_>
  local_90;
  iterator i_2;
  vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> framebuffers;
  __normal_iterator<sglr::rc::Texture_**,_std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>_>
  local_68;
  __normal_iterator<sglr::rc::Texture_**,_std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>_>
  local_60;
  iterator i_1;
  vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> textures;
  __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
  local_38;
  __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
  local_30;
  iterator i;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  ReferenceContext *this_local;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__ReferenceContext_015cc5a8;
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::vector
            ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&i);
  rc::ObjectManager<sglr::rc::VertexArray>::getAll
            (&this->m_vertexArrays,
             (vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&i);
  local_30._M_current =
       (VertexArray **)
       std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::begin
                 ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&i);
  while( true ) {
    local_38._M_current =
         (VertexArray **)
         std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::end
                   ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&i)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
              ::operator*(&local_30);
    deleteVertexArray(this,*ppVVar2);
    __gnu_cxx::
    __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
    ::operator++(&local_30,0);
  }
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::~vector
            ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&i);
  std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>::vector
            ((vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&i_1);
  rc::ObjectManager<sglr::rc::Texture>::getAll
            (&this->m_textures,
             (vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&i_1);
  local_60._M_current =
       (Texture **)
       std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>::begin
                 ((vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&i_1);
  while( true ) {
    local_68._M_current =
         (Texture **)
         std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>::end
                   ((vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&i_1);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<sglr::rc::Texture_**,_std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>_>
              ::operator*(&local_60);
    deleteTexture(this,*ppTVar3);
    __gnu_cxx::
    __normal_iterator<sglr::rc::Texture_**,_std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>_>
    ::operator++(&local_60,0);
  }
  std::vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>::~vector
            ((vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&i_1);
  std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>::vector
            ((vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&i_2);
  rc::ObjectManager<sglr::rc::Framebuffer>::getAll
            (&this->m_framebuffers,
             (vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&i_2);
  local_90._M_current =
       (Framebuffer **)
       std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>::begin
                 ((vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&i_2)
  ;
  while( true ) {
    local_98._M_current =
         (Framebuffer **)
         std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>::end
                   ((vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)
                    &i_2);
    bVar1 = __gnu_cxx::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<sglr::rc::Framebuffer_**,_std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>_>
              ::operator*(&local_90);
    deleteFramebuffer(this,*ppFVar4);
    __gnu_cxx::
    __normal_iterator<sglr::rc::Framebuffer_**,_std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>_>
    ::operator++(&local_90,0);
  }
  std::vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>::~vector
            ((vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&i_2);
  std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::vector
            ((vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)&i_3);
  rc::ObjectManager<sglr::rc::Renderbuffer>::getAll
            (&this->m_renderbuffers,
             (vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)&i_3);
  local_c0._M_current =
       (Renderbuffer **)
       std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::begin
                 ((vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)
                  &i_3);
  while( true ) {
    local_c8._M_current =
         (Renderbuffer **)
         std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::end
                   ((vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)
                    &i_3);
    bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (!bVar1) break;
    ppRVar5 = __gnu_cxx::
              __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
              ::operator*(&local_c0);
    deleteRenderbuffer(this,*ppRVar5);
    __gnu_cxx::
    __normal_iterator<sglr::rc::Renderbuffer_**,_std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>_>
    ::operator++(&local_c0,0);
  }
  std::vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::~vector
            ((vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)&i_3);
  std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::vector
            ((vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&i_4);
  rc::ObjectManager<sglr::rc::DataBuffer>::getAll
            (&this->m_buffers,
             (vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&i_4);
  local_f0._M_current =
       (DataBuffer **)
       std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::begin
                 ((vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&i_4);
  while( true ) {
    local_f8._M_current =
         (DataBuffer **)
         std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::end
                   ((vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&i_4)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
    if (!bVar1) break;
    ppDVar6 = __gnu_cxx::
              __normal_iterator<sglr::rc::DataBuffer_**,_std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>_>
              ::operator*(&local_f0);
    deleteBuffer(this,*ppDVar6);
    __gnu_cxx::
    __normal_iterator<sglr::rc::DataBuffer_**,_std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>_>
    ::operator++(&local_f0,0);
  }
  std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::~vector
            ((vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&i_4);
  std::
  vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
  ::vector((vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
            *)&i_5);
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::getAll
            (&this->m_programs,
             (vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
              *)&i_5);
  local_120._M_current =
       (ShaderProgramObjectContainer **)
       std::
       vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
       ::begin((vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
                *)&i_5);
  while( true ) {
    local_128._M_current =
         (ShaderProgramObjectContainer **)
         std::
         vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
         ::end((vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
                *)&i_5);
    bVar1 = __gnu_cxx::operator!=(&local_120,&local_128);
    if (!bVar1) break;
    ppSVar7 = __gnu_cxx::
              __normal_iterator<sglr::rc::ShaderProgramObjectContainer_**,_std::vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>_>
              ::operator*(&local_120);
    deleteProgramObject(this,*ppSVar7);
    __gnu_cxx::
    __normal_iterator<sglr::rc::ShaderProgramObjectContainer_**,_std::vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>_>
    ::operator++(&local_120,0);
  }
  std::
  vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
  ::~vector((vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
             *)&i_5);
  std::vector<float,_std::allocator<float>_>::~vector(&this->m_fragmentDepths);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::~vector(&this->m_fragmentBuffer);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::~vector(&this->m_currentAttribs);
  rc::TextureCubeArray::~TextureCubeArray(&this->m_emptyTexCubeArray);
  rc::Texture3D::~Texture3D(&this->m_emptyTex3D);
  rc::Texture2DArray::~Texture2DArray(&this->m_emptyTex2DArray);
  rc::TextureCube::~TextureCube(&this->m_emptyTexCube);
  rc::Texture2D::~Texture2D(&this->m_emptyTex2D);
  rc::Texture1D::~Texture1D(&this->m_emptyTex1D);
  std::
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  ::~vector(&this->m_textureUnits);
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::~ObjectManager(&this->m_programs);
  rc::ObjectManager<sglr::rc::VertexArray>::~ObjectManager(&this->m_vertexArrays);
  rc::ObjectManager<sglr::rc::DataBuffer>::~ObjectManager(&this->m_buffers);
  rc::ObjectManager<sglr::rc::Renderbuffer>::~ObjectManager(&this->m_renderbuffers);
  rc::ObjectManager<sglr::rc::Framebuffer>::~ObjectManager(&this->m_framebuffers);
  rc::ObjectManager<sglr::rc::Texture>::~ObjectManager(&this->m_textures);
  rc::VertexArray::~VertexArray(&this->m_clientVertexArray);
  ReferenceContextLimits::~ReferenceContextLimits(&this->m_limits);
  Context::~Context(&this->super_Context);
  return;
}

Assistant:

ReferenceContext::~ReferenceContext (void)
{
	// Destroy all objects -- verifies that ref counting works
	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
			deleteVertexArray(*i);

		DE_ASSERT(m_clientVertexArray.getRefCount() == 1);
	}

	{
		vector<Texture*> textures;
		m_textures.getAll(textures);
		for (vector<Texture*>::iterator i = textures.begin(); i != textures.end(); i++)
			deleteTexture(*i);
	}

	{
		vector<Framebuffer*> framebuffers;
		m_framebuffers.getAll(framebuffers);
		for (vector<Framebuffer*>::iterator i = framebuffers.begin(); i != framebuffers.end(); i++)
			deleteFramebuffer(*i);
	}

	{
		vector<Renderbuffer*> renderbuffers;
		m_renderbuffers.getAll(renderbuffers);
		for (vector<Renderbuffer*>::iterator i = renderbuffers.begin(); i != renderbuffers.end(); i++)
			deleteRenderbuffer(*i);
	}

	{
		vector<DataBuffer*> buffers;
		m_buffers.getAll(buffers);
		for (vector<DataBuffer*>::iterator i = buffers.begin(); i != buffers.end(); i++)
			deleteBuffer(*i);
	}

	{
		vector<ShaderProgramObjectContainer*> programs;
		m_programs.getAll(programs);
		for (vector<ShaderProgramObjectContainer*>::iterator i = programs.begin(); i != programs.end(); i++)
			deleteProgramObject(*i);
	}
}